

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O3

String * __thiscall
kj::str<char_const(&)[54],kj::String,kj::String,char>
          (String *__return_storage_ptr__,kj *this,char (*params) [54],String *params_1,
          String *params_2,char *params_3)

{
  long lVar1;
  char *pcVar2;
  undefined1 local_59 [9];
  char *local_50;
  kj *local_48;
  size_t local_40;
  ArrayPtr<const_char> local_38;
  
  local_40 = strlen((char *)this);
  lVar1 = *(long *)(*params + 8);
  local_59._1_8_ = lVar1;
  if (lVar1 != 0) {
    local_59._1_8_ = *(undefined8 *)*params;
  }
  local_50 = (char *)(lVar1 + -1);
  if (lVar1 == 0) {
    local_50 = (char *)0x0;
  }
  pcVar2 = (char *)(params_1->content).size_;
  local_38.ptr = pcVar2;
  if (pcVar2 != (char *)0x0) {
    local_38.ptr = (params_1->content).ptr;
  }
  local_38.size_ = (size_t)(pcVar2 + -1);
  if (pcVar2 == (char *)0x0) {
    local_38.size_ = (size_t)(char *)0x0;
  }
  local_59[0] = *(undefined1 *)&(params_2->content).ptr;
  local_48 = this;
  _::
  concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::FixedArray<char,1ul>>
            (__return_storage_ptr__,(_ *)&local_48,(ArrayPtr<const_char> *)(local_59 + 1),&local_38,
             (ArrayPtr<const_char> *)local_59,(FixedArray<char,_1UL> *)params_3);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}